

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O0

void __thiscall
ut11::Mock<int_(char)>::Verify<char>
          (Mock<int_(char)> *this,size_t line,string *file,char *expectations)

{
  string *line_00;
  size_t sVar1;
  Mock<int(char)> local_68 [32];
  string local_48 [32];
  char *local_28;
  char *expectations_local;
  string *file_local;
  size_t line_local;
  Mock<int_(char)> *this_local;
  
  local_28 = expectations;
  expectations_local = (char *)file;
  file_local = (string *)line;
  line_local = (size_t)this;
  sVar1 = detail::MockArgumentHandler<char>::CountCalls<char>
                    (&this->m_argumentHandler,*expectations);
  line_00 = file_local;
  if (sVar1 == 0) {
    std::__cxx11::string::string(local_48,(string *)file);
    Mock<int(char)>::GetVerifyFailMessage_abi_cxx11_(local_68);
    Assert::Fail((size_t)line_00,(string *)local_48,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void Verify(std::size_t line, std::string file, const Expectations&... expectations) const
		{
			if ( m_argumentHandler.CountCalls(expectations...) == 0 )
				Assert::Fail(line, file, GetVerifyFailMessage());
		}